

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O3

void __thiscall r_exec::CSTOverlay::CSTOverlay(CSTOverlay *this,CSTOverlay *original)

{
  int64_t iVar1;
  int64_t iVar2;
  uint64_t uVar3;
  
  HLPOverlay::HLPOverlay
            (&this->super_HLPOverlay,(original->super_HLPOverlay).super_Overlay.controller,
             (HLPBindingMap *)(original->super_HLPOverlay).bindings.object);
  (this->super_HLPOverlay).super_Overlay.super__Object._vptr__Object =
       (_func_int **)&PTR__CSTOverlay_001be550;
  (this->inputs).
  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputs).
  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->predictions)._M_h._M_buckets = &(this->predictions)._M_h._M_single_bucket;
  (this->predictions)._M_h._M_bucket_count = 1;
  (this->predictions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->predictions)._M_h._M_element_count = 0;
  (this->predictions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->predictions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->predictions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->simulations)._M_h._M_buckets = &(this->simulations)._M_h._M_single_bucket;
  (this->simulations)._M_h._M_bucket_count = 1;
  (this->simulations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->simulations)._M_h._M_element_count = 0;
  (this->simulations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->simulations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->simulations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ::operator=(&(this->super_HLPOverlay).patterns.cells,&(original->super_HLPOverlay).patterns.cells)
  ;
  (this->super_HLPOverlay).patterns.free_cell_count =
       (original->super_HLPOverlay).patterns.free_cell_count;
  iVar1 = (original->super_HLPOverlay).patterns.used_cells_head;
  iVar2 = (original->super_HLPOverlay).patterns.used_cells_tail;
  uVar3 = (original->super_HLPOverlay).patterns.used_cell_count;
  (this->super_HLPOverlay).patterns.free_cells = (original->super_HLPOverlay).patterns.free_cells;
  (this->super_HLPOverlay).patterns.used_cell_count = uVar3;
  (this->super_HLPOverlay).patterns.used_cells_head = iVar1;
  (this->super_HLPOverlay).patterns.used_cells_tail = iVar2;
  if (original != this) {
    std::
    _Hashtable<core::P<r_exec::_Fact>,core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::_Fact>>,r_code::PHash<r_exec::_Fact>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<core::P<r_exec::_Fact>,core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::_Fact>>,r_code::PHash<r_exec::_Fact>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<core::P<r_exec::_Fact>,core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::_Fact>>,r_code::PHash<r_exec::_Fact>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->predictions,&(original->predictions)._M_h);
    std::
    _Hashtable<core::P<r_exec::Sim>,core::P<r_exec::Sim>,std::allocator<core::P<r_exec::Sim>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::Sim>>,r_code::PHash<r_exec::Sim>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<core::P<r_exec::Sim>,core::P<r_exec::Sim>,std::allocator<core::P<r_exec::Sim>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::Sim>>,r_code::PHash<r_exec::Sim>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<core::P<r_exec::Sim>,core::P<r_exec::Sim>,std::allocator<core::P<r_exec::Sim>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::Sim>>,r_code::PHash<r_exec::Sim>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->simulations,&(original->simulations)._M_h);
  }
  this->match_deadline = original->match_deadline;
  this->lowest_cfd = original->lowest_cfd;
  return;
}

Assistant:

CSTOverlay::CSTOverlay(const CSTOverlay *original): HLPOverlay(original->controller, original->bindings)
{
    patterns = original->patterns;
    predictions = original->predictions;
    simulations = original->simulations;
    match_deadline = original->match_deadline;
    lowest_cfd = original->lowest_cfd;
}